

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusNonStationaryQPlanner.cpp
# Opt level: O0

void __thiscall PerseusNonStationaryQPlanner::PlanAll(PerseusNonStationaryQPlanner *this)

{
  PlanningUnitDecPOMDPDiscrete *pPVar1;
  BeliefSet *Beliefs;
  vector<double,_std::allocator<double>_> *pvVar2;
  size_t sVar3;
  BeliefSet *pBVar4;
  JointBeliefInterface *pJVar5;
  ostream *poVar6;
  reference Belief;
  void *this_00;
  QFunctionsDiscrete *in_RDI;
  Perseus *in_stack_00000080;
  Perseus *in_stack_000000e0;
  JointBeliefInterface *jb0;
  int t;
  int lastTimestep;
  vector<double,_std::allocator<double>_> VBnew;
  vector<double,_std::allocator<double>_> VB;
  QFunctionsDiscrete Qt1;
  QFunctionsDiscrete Qt;
  QFunctionsDiscreteNonStationary Q;
  undefined4 in_stack_fffffffffffffe08;
  Index in_stack_fffffffffffffe0c;
  BeliefSetNonStationary *in_stack_fffffffffffffe10;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe18;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffe20;
  size_type in_stack_fffffffffffffe28;
  QFunctionsDiscrete *Q_00;
  vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
  *in_stack_fffffffffffffe30;
  Perseus *in_stack_fffffffffffffe90;
  pointer this_01;
  string local_128 [32];
  Perseus *in_stack_fffffffffffffef8;
  undefined1 local_e8 [48];
  int local_b8;
  int local_b4;
  undefined1 local_68 [72];
  undefined1 local_20 [32];
  
  Perseus::PlanLeadIn(in_stack_fffffffffffffe90);
  pPVar1 = AlphaVectorPlanning::GetPU
                     ((AlphaVectorPlanning *)
                      CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  Beliefs = (BeliefSet *)PlanningUnit::GetHorizon((PlanningUnit *)pPVar1);
  std::
  allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>
  ::allocator((allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>
               *)0x95d200);
  std::
  vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
  ::vector(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
           (allocator_type *)in_stack_fffffffffffffe20);
  std::
  allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>
  ::~allocator((allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>
                *)0x95d22c);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
            *)0x95d239);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
            *)0x95d246);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x95d253);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x95d260);
  this_01 = in_RDI[7].
            super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = AlphaVectorPlanning::GetPU
                     ((AlphaVectorPlanning *)
                      CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  pvVar2 = (vector<double,_std::allocator<double>_> *)
           PlanningUnit::GetHorizon((PlanningUnit *)pPVar1);
  BeliefSetNonStationary::Get(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
  BeliefValue::GetValues(Beliefs,in_RDI);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe20);
  pPVar1 = AlphaVectorPlanning::GetPU
                     ((AlphaVectorPlanning *)
                      CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  sVar3 = PlanningUnit::GetHorizon((PlanningUnit *)pPVar1);
  local_b8 = (int)sVar3;
  local_b4 = local_b8;
  for (; -1 < local_b8; local_b8 = local_b8 + -1) {
    Perseus::
    PlanStartOfIteration<std::vector<std::vector<AlphaVector,std::allocator<AlphaVector>>,std::allocator<std::vector<AlphaVector,std::allocator<AlphaVector>>>>>
              ((Perseus *)
               Qt1.
               super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               VB.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_,
               (vector<double,_std::allocator<double>_> *)
               VB.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                *)VB.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start);
    if (local_b8 == local_b4) {
      Perseus::GetInitialQFunctions(in_stack_fffffffffffffef8);
      std::
      vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
      ::operator=((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                   *)in_stack_fffffffffffffe20,
                  (vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                   *)in_stack_fffffffffffffe18);
      std::
      vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
      ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                 *)in_stack_fffffffffffffe20);
    }
    else {
      pBVar4 = BeliefSetNonStationary::Get(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
      (*(code *)*(pointer *)
                 ((long)&(in_RDI->
                         super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[4].
                         super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                         super__Vector_impl_data + 0x10))(local_e8,in_RDI,pBVar4,local_68);
      std::
      vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
      ::operator=((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                   *)in_stack_fffffffffffffe20,
                  (vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                   *)in_stack_fffffffffffffe18);
      std::
      vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
      ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                 *)in_stack_fffffffffffffe20);
      BeliefSetNonStationary::Get(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
      BeliefValue::GetValues(Beliefs,in_RDI);
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe20,
                 in_stack_fffffffffffffe18);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe20);
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)this_01,pvVar2);
      std::
      vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
      ::at((vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
            *)in_stack_fffffffffffffe10,
           CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      std::
      vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
      ::operator=((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                   *)this_01,
                  (vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                   *)pvVar2);
    }
    std::
    vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
    ::operator=((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                 *)this_01,
                (vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                 *)pvVar2);
    Perseus::PlanEndOfIteration(in_stack_00000080);
  }
  (*(code *)*(pointer *)
             ((long)&(in_RDI->
                     super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[1].
                     super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                     super__Vector_impl_data + 8))(in_RDI,local_20);
  if (((ulong)in_RDI[5].
              super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x1000000) == 0) {
    (*(code *)*(pointer *)
               ((long)&(in_RDI->
                       super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[2].
                       super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
                       super__Vector_impl_data + 8))(in_RDI,in_RDI + 3);
  }
  AlphaVectorPlanning::GetPU
            ((AlphaVectorPlanning *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  pJVar5 = PlanningUnitMADPDiscrete::GetNewJointBeliefFromISD(in_stack_fffffffffffffe20);
  Perseus::GetIdentification_abi_cxx11_
            ((Perseus *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  poVar6 = std::operator<<((ostream *)&std::cout,local_128);
  poVar6 = std::operator<<(poVar6,": final Vjb0 = ");
  Q_00 = (QFunctionsDiscrete *)((long)&pJVar5->field_0x0 + *(long *)((long)*pJVar5 + -0xb8));
  Belief = std::
           vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
           ::at((vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                 *)in_stack_fffffffffffffe10,
                CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  pvVar2 = (vector<double,_std::allocator<double>_> *)
           BeliefValue::GetValue((BeliefInterface *)Belief,Q_00);
  this_00 = (void *)std::ostream::operator<<(poVar6,(double)pvVar2);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_128);
  if (pJVar5 != (JointBeliefInterface *)0x0) {
    (**(code **)((long)*pJVar5 + 8))();
  }
  Perseus::PlanLeadOut(in_stack_000000e0);
  std::vector<double,_std::allocator<double>_>::~vector(pvVar2);
  std::vector<double,_std::allocator<double>_>::~vector(pvVar2);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             *)pvVar2);
  std::
  vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
  ::~vector((vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
             *)pvVar2);
  std::
  vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
  ::~vector((vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
             *)pvVar2);
  return;
}

Assistant:

void PerseusNonStationaryQPlanner::PlanAll()
{
    PlanLeadIn();

    QFunctionsDiscreteNonStationary Q(GetPU()->GetHorizon());
    QFunctionsDiscrete Qt,Qt1;
    // records the value of each belief in the belief set
    vector<double> VB,VBnew;
    
    VB=BeliefValue::GetValues(_m_beliefs->Get(GetPU()->GetHorizon()),Qt);

    int lastTimestep=GetPU()->GetHorizon();
    for(int t=lastTimestep;t>=0;--t)
    {
        // print out some info
        PlanStartOfIteration(t,VB,Qt);

        // the real thing: compute the next stage value function
        if(t==lastTimestep)
            Qt=GetInitialQFunctions();
        else
        {
            Qt=BackupStageAll(_m_beliefs->Get(t),Qt1);

            // compute the maximum difference in the values for all
            // beliefs: for the convergence test
            VBnew=BeliefValue::GetValues(_m_beliefs->Get(t),Qt);
            
            VB=VBnew;
            Q.at(t)=Qt;
        }

        Qt1=Qt;
        PlanEndOfIteration();
    }

    StoreValueFunction(Q);
    if(!_m_dryrun)
        ExportValueFunction(_m_valueFunctionFilename);
            
    JointBeliefInterface* jb0 = GetPU()->GetNewJointBeliefFromISD();
    cout << GetIdentification() << ": final Vjb0 = "
         << BeliefValue::GetValue( *jb0, Q.at(0)) <<  endl;
    delete jb0;

    PlanLeadOut();
}